

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::reset_common(Snes_Spc *this,int timer_counter_init)

{
  undefined1 in_SIL;
  long in_RDI;
  Snes_Spc *unaff_retaddr;
  int i;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    *(undefined1 *)(in_RDI + 0x858 + (long)(local_10 + 0xd)) = in_SIL;
  }
  memset((void *)(in_RDI + 0x868),0,0x18);
  *(undefined4 *)(in_RDI + 0x868) = 0xffc0;
  *(undefined1 *)(in_RDI + 0x848) = 10;
  *(undefined1 *)(in_RDI + 0x849) = 0xb0;
  for (local_10 = 0; local_10 < 4; local_10 = local_10 + 1) {
    *(undefined1 *)(in_RDI + 0x858 + (long)(local_10 + 4)) = 0;
  }
  reset_time_regs(unaff_retaddr);
  return;
}

Assistant:

void Snes_Spc::reset_common( int timer_counter_init )
{
	int i;
	for ( i = 0; i < timer_count; i++ )
		REGS_IN [r_t0out + i] = timer_counter_init;
	
	// Run IPL ROM
	memset( &m.cpu_regs, 0, sizeof m.cpu_regs );
	m.cpu_regs.pc = rom_addr;
	
	REGS [r_test   ] = 0x0A;
	REGS [r_control] = 0xB0; // ROM enabled, clear ports
	for ( i = 0; i < port_count; i++ )
		REGS_IN [r_cpuio0 + i] = 0;
	
	reset_time_regs();
}